

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# comm.c
# Opt level: O0

bool process_output(DESCRIPTOR_DATA *d,bool fPrompt)

{
  bool bVar1;
  char *pcVar2;
  byte in_SIL;
  long in_RDI;
  __type_conflict2 _Var3;
  char buf [4608];
  char wound [100];
  int percent;
  CHAR_DATA *victim;
  CHAR_DATA *ch;
  CHAR_DATA *in_stack_00003660;
  CHAR_DATA *in_stack_ffffffffffffed18;
  CHAR_DATA *in_stack_ffffffffffffed20;
  ulong uVar4;
  CHAR_DATA *in_stack_ffffffffffffed28;
  CHAR_DATA *in_stack_ffffffffffffed30;
  int iVar5;
  CHAR_DATA *in_stack_ffffffffffffed38;
  undefined4 in_stack_ffffffffffffed40;
  int in_stack_ffffffffffffed44;
  char *in_stack_ffffffffffffed48;
  int desc;
  char *in_stack_ffffffffffffed50;
  char local_1298 [4608];
  char local_98 [108];
  int local_2c;
  long local_28;
  CHAR_DATA *local_20;
  byte local_11;
  long local_10;
  bool local_1;
  
  desc = (int)in_stack_ffffffffffffed50;
  local_11 = in_SIL & 1;
  iVar5 = (int)((ulong)in_stack_ffffffffffffed30 >> 0x20);
  local_10 = in_RDI;
  if ((merc_down) || (*(long *)(in_RDI + 0x6c58) == 0)) {
    if (*(long *)(in_RDI + 0x6c68) == 0) {
      if (((!merc_down) && (local_11 != 0)) && (*(short *)(in_RDI + 0x32) == 0)) {
        local_20 = *(CHAR_DATA **)(in_RDI + 0x10);
        local_28 = *(long *)((long)local_20 + 0x20);
        if (local_28 != 0) {
          if (*(short *)(local_28 + 0x15c) < 1) {
            local_2c = -1;
          }
          else {
            local_2c = (*(int *)(local_28 + 0x158) * 100) / (int)*(short *)(local_28 + 0x15c);
          }
          pcVar2 = get_battle_condition
                             (in_stack_ffffffffffffed28,
                              (int)((ulong)in_stack_ffffffffffffed20 >> 0x20));
          sprintf(local_98,"%s",pcVar2);
          bVar1 = can_see(in_stack_ffffffffffffed38,in_stack_ffffffffffffed30);
          iVar5 = (int)((ulong)in_stack_ffffffffffffed30 >> 0x20);
          if (bVar1) {
            bVar1 = is_npc(in_stack_ffffffffffffed18);
            if (bVar1) {
              in_stack_ffffffffffffed48 = *(char **)(local_28 + 0x108);
              in_stack_ffffffffffffed50 = in_stack_ffffffffffffed48;
            }
            else {
              in_stack_ffffffffffffed48 = pers(in_stack_ffffffffffffed28,in_stack_ffffffffffffed20);
              in_stack_ffffffffffffed50 = in_stack_ffffffffffffed48;
            }
          }
          else {
            in_stack_ffffffffffffed48 = "Someone";
          }
          desc = (int)in_stack_ffffffffffffed50;
          sprintf(local_1298,"%s %s \n\r",in_stack_ffffffffffffed48,local_98);
          if ((local_1298[0] < 'a') || ('z' < local_1298[0])) {
            in_stack_ffffffffffffed44 = (int)local_1298[0];
          }
          else {
            in_stack_ffffffffffffed44 = local_1298[0] + -0x20;
          }
          local_1298[0] = (char)in_stack_ffffffffffffed44;
          write_to_buffer((DESCRIPTOR_DATA *)
                          CONCAT44(in_stack_ffffffffffffed44,in_stack_ffffffffffffed40),
                          (char *)in_stack_ffffffffffffed38,iVar5);
          bVar1 = is_immortal(in_stack_ffffffffffffed18);
          if (bVar1) {
            sprintf(local_1298,"(Waiting: %d)\n\r",
                    (long)(int)*(short *)((long)local_20 + 0x152) / 0xc & 0xffffffff);
            write_to_buffer((DESCRIPTOR_DATA *)
                            CONCAT44(in_stack_ffffffffffffed44,in_stack_ffffffffffffed40),
                            (char *)in_stack_ffffffffffffed38,iVar5);
          }
        }
        if (*(long *)(local_10 + 0x18) == 0) {
          in_stack_ffffffffffffed38 = *(CHAR_DATA **)(local_10 + 0x10);
        }
        else {
          in_stack_ffffffffffffed38 = *(CHAR_DATA **)(local_10 + 0x18);
        }
        in_stack_ffffffffffffed30 = (CHAR_DATA *)in_stack_ffffffffffffed38->comm[0];
        local_20 = in_stack_ffffffffffffed38;
        _Var3 = std::pow<int,int>(0,0x5ae8ba);
        if (((ulong)in_stack_ffffffffffffed30 & (long)_Var3) == 0) {
          write_to_buffer((DESCRIPTOR_DATA *)
                          CONCAT44(in_stack_ffffffffffffed44,in_stack_ffffffffffffed40),
                          (char *)in_stack_ffffffffffffed38,
                          (int)((ulong)in_stack_ffffffffffffed30 >> 0x20));
        }
        bVar1 = is_npc(in_stack_ffffffffffffed18);
        if ((bVar1) || ((local_20->pcdata->entering_text & 1U) == 0)) {
          uVar4 = local_20->comm[0];
          _Var3 = std::pow<int,int>(0,0x5ae94d);
          if ((uVar4 & (long)_Var3) != 0) {
            bust_a_prompt(in_stack_00003660);
          }
        }
        else {
          write_to_buffer((DESCRIPTOR_DATA *)
                          CONCAT44(in_stack_ffffffffffffed44,in_stack_ffffffffffffed40),
                          (char *)in_stack_ffffffffffffed38,
                          (int)((ulong)in_stack_ffffffffffffed30 >> 0x20));
        }
        uVar4 = local_20->comm[0];
        _Var3 = std::pow<int,int>(0,0x5ae996);
        if ((uVar4 & (long)_Var3) != 0) {
          write_to_buffer((DESCRIPTOR_DATA *)
                          CONCAT44(in_stack_ffffffffffffed44,in_stack_ffffffffffffed40),
                          (char *)in_stack_ffffffffffffed38,
                          (int)((ulong)in_stack_ffffffffffffed30 >> 0x20));
        }
      }
      iVar5 = (int)((ulong)in_stack_ffffffffffffed30 >> 0x20);
    }
    else {
      write_to_buffer((DESCRIPTOR_DATA *)
                      CONCAT44(in_stack_ffffffffffffed44,in_stack_ffffffffffffed40),
                      (char *)in_stack_ffffffffffffed38,iVar5);
      iVar5 = (int)((ulong)in_stack_ffffffffffffed30 >> 0x20);
    }
  }
  else {
    write_to_buffer((DESCRIPTOR_DATA *)CONCAT44(in_stack_ffffffffffffed44,in_stack_ffffffffffffed40)
                    ,(char *)in_stack_ffffffffffffed38,iVar5);
    iVar5 = (int)((ulong)in_stack_ffffffffffffed30 >> 0x20);
  }
  if (*(int *)(local_10 + 0x6c4c) == 0) {
    local_1 = true;
  }
  else {
    if (*(long *)(local_10 + 8) != 0) {
      if (*(long *)(local_10 + 0x10) != 0) {
        write_to_buffer((DESCRIPTOR_DATA *)
                        CONCAT44(in_stack_ffffffffffffed44,in_stack_ffffffffffffed40),
                        (char *)in_stack_ffffffffffffed38,iVar5);
      }
      write_to_buffer((DESCRIPTOR_DATA *)
                      CONCAT44(in_stack_ffffffffffffed44,in_stack_ffffffffffffed40),
                      (char *)in_stack_ffffffffffffed38,iVar5);
      write_to_buffer((DESCRIPTOR_DATA *)
                      CONCAT44(in_stack_ffffffffffffed44,in_stack_ffffffffffffed40),
                      (char *)in_stack_ffffffffffffed38,iVar5);
    }
    bVar1 = write_to_descriptor(desc,in_stack_ffffffffffffed48,in_stack_ffffffffffffed44);
    if (bVar1) {
      *(undefined4 *)(local_10 + 0x6c4c) = 0;
      local_1 = true;
    }
    else {
      *(undefined4 *)(local_10 + 0x6c4c) = 0;
      local_1 = false;
    }
  }
  return local_1;
}

Assistant:

bool process_output(DESCRIPTOR_DATA *d, bool fPrompt)
{
	/*
	 * Bust a prompt.
	 */
	if (!merc_down && d->showstr_point)
	{
		write_to_buffer(d, "[Hit Return to continue]\n\r", 0);
	}
	else if (d->pString != nullptr)
	{
		write_to_buffer(d, "EDIT> ", 0);
	}
	else if (!merc_down && fPrompt && d->connected == CON_PLAYING)
	{
		CHAR_DATA *ch;
		CHAR_DATA *victim;

		ch = d->character;

		/* battle prompt */
		if ((victim = ch->fighting) != nullptr)
		{
			int percent;
			char wound[100];
			char buf[MAX_STRING_LENGTH];

			if (victim->max_hit > 0)
				percent = victim->hit * 100 / victim->max_hit;
			else
				percent = -1;

			sprintf(wound, "%s", get_battle_condition(victim, percent));

			sprintf(buf, "%s %s \n\r",
				(can_see(ch, victim)) ? (is_npc(victim) ? victim->short_descr : pers(victim, ch)) : "Someone",
				wound);
			buf[0] = UPPER(buf[0]);
			write_to_buffer(d, buf, 0);

			if (is_immortal(ch))
			{
				sprintf(buf, "(Waiting: %d)\n\r", (ch->wait / PULSE_VIOLENCE));
				write_to_buffer(d, buf, 0);
			}
		}

		ch = d->original ? d->original : d->character;
		if (!IS_SET(ch->comm, COMM_COMPACT))
			write_to_buffer(d, "\n\r", 2);
		if (!is_npc(ch) && ch->pcdata->entering_text)
			write_to_buffer(d, ": ", 2);
		else if (IS_SET(ch->comm, COMM_PROMPT))
			bust_a_prompt(d->character);

		if (IS_SET(ch->comm, COMM_TELNET_GA))
			write_to_buffer(d, go_ahead_str, 0);
	}

	/*
	 * Short-circuit if nothing to write.
	 */
	if (d->outtop == 0)
		return true;

	/*
	 * Snoop-o-rama.
	 */
	if (d->snoop_by != nullptr)
	{
		if (d->character != nullptr)
			write_to_buffer(d->snoop_by, d->character->name, 0);

		write_to_buffer(d->snoop_by, "> ", 2);
		write_to_buffer(d->snoop_by, d->outbuf, d->outtop);
	}

	/*
	 * OS-dependent output.
	 *
	 * now done at output_buffer( ) to deal with color codes.
	 * - Wreck
	 */
	/*    return output_buffer( d );*/
	if (!write_to_descriptor(d->descriptor, d->outbuf, d->outtop))
	{
		d->outtop = 0;
		return false;
	}
	else
	{
		d->outtop = 0;
		return true;
	}
}